

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O0

void __thiscall
GrcErrorList::SetFileNameFromGdlFile(GrcErrorList *this,GrcManager *pcman,char *pchGdlFile)

{
  size_t sVar1;
  char *in_RDX;
  long in_RDI;
  bool bVar2;
  char *pchEnd;
  int pos;
  string strErrFileName;
  GrcManager *in_stack_ffffffffffffff88;
  char *local_58;
  int local_3c;
  string local_38 [32];
  char *local_18;
  
  local_18 = in_RDX;
  GrcManager::ErrorFileName_abi_cxx11_(in_stack_ffffffffffffff88);
  local_3c = std::__cxx11::string::find((char)local_38,0x5c);
  if (local_3c == -1) {
    local_3c = std::__cxx11::string::find((char)local_38,0x2f);
  }
  local_58 = local_18;
  if (local_3c == -1) {
    sVar1 = strlen(local_18);
    local_58 = local_58 + sVar1;
    while( true ) {
      bVar2 = false;
      if (*local_58 != '\\') {
        bVar2 = *local_58 != '/';
      }
      if (!bVar2) {
        std::__cxx11::string::assign((char *)(in_RDI + 0x38),(ulong)local_18);
        std::__cxx11::string::append((string *)(in_RDI + 0x38));
        goto LAB_001ad2a2;
      }
      if (local_58 <= local_18) break;
      local_58 = local_58 + -1;
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 0x38),local_38);
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x38),local_38);
  }
LAB_001ad2a2:
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void GrcErrorList::SetFileNameFromGdlFile(GrcManager * pcman, char * pchGdlFile)
{
	std::string strErrFileName = pcman->ErrorFileName();
	int pos = (int)strErrFileName.find('\\');
	if (pos == -1)
		pos = (int)strErrFileName.find('/');
	if (pos != -1)
	{
		// path is indicated in the specified filename; don't change it
		m_strErrFile = strErrFileName;
		return;
	}

	char * pchEnd = pchGdlFile + strlen(pchGdlFile);
	while (*pchEnd != '\\' && *pchEnd != '/')
	{
		if (pchEnd <= pchGdlFile)
		{
			m_strErrFile = strErrFileName;  // GDL file has no path specified
			return;
		}
		pchEnd--;
	}
	m_strErrFile.assign(pchGdlFile, (pchEnd - pchGdlFile + 1));
	m_strErrFile.append(strErrFileName);
}